

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm83.cpp
# Opt level: O2

void __thiscall SM83::pop_rr<(SM83::Registers)8>(SM83 *this)

{
  format_string<unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_std::basic_string_view<char>_>
  fmt;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffe0;
  unsigned_short local_18 [4];
  char *local_10;
  
  local_18[0] = 2;
  local_18[1] = 0;
  local_18[2] = 0;
  local_18[3] = 0;
  local_10 = "AF";
  fmt.str_.size_ = (size_t)this;
  fmt.str_.data_ = (char *)0x44;
  ::fmt::v11::
  print<unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,std::basic_string_view<char,std::char_traits<char>>>
            ((v11 *)"AF={:04X} BC={:04X} DE={:04X} HL={:04X} SP={:04X} PC={:04X}  POP {}\n",fmt,
             &(this->field_1).bc,&(this->field_2).de,&(this->field_3).hl,&this->sp,
             &this->pc_at_opcode,local_18,in_stack_ffffffffffffffe0);
  StackPop(this,(u16 *)this);
  (this->field_0).field_1.f = (this->field_0).field_1.f & 0xf0;
  return;
}

Assistant:

void SM83::pop_rr() {
    LTRACE("POP {}", Get16bitRegisterName<Register>());
    StackPop(Get16bitRegisterPointer<Register>());

    if constexpr (Register == Registers::AF) {
        // Lowest 4 bits are always 0
        f &= ~0x0F;
    }
}